

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strip.cpp
# Opt level: O1

void __thiscall wasm::Strip::Strip(Strip *this,Decider *decider)

{
  (this->super_Pass).runner = (PassRunner *)0x0;
  (this->super_Pass).name._M_dataplus._M_p = (pointer)&(this->super_Pass).name.field_2;
  (this->super_Pass).name._M_string_length = 0;
  (this->super_Pass).name.field_2._M_local_buf[0] = '\0';
  (this->super_Pass).passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Strip_01094f70;
  std::function<bool_(wasm::CustomSection_&)>::function(&this->decider,decider);
  return;
}

Assistant:

Strip(Decider decider) : decider(decider) {}